

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O1

int flatcc_verify_union_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  ushort uVar4;
  int iVar5;
  ushort uVar6;
  uint uVar7;
  flatbuffers_uoffset_t k;
  uint uVar8;
  flatbuffers_voffset_t vo;
  ushort uVar9;
  uint *puVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  flatbuffers_uoffset_t base;
  flatcc_union_verifier_descriptor_t local_58;
  uint local_34;
  
  uVar9 = id * 2 + 2;
  uVar6 = td->vsize;
  if ((uVar6 <= uVar9) || (*(short *)((long)td->vtable + (ulong)uVar9) == 0)) {
    uVar4 = id * 2 + 4;
    if (uVar4 < uVar6) {
      bVar12 = *(short *)((long)td->vtable + (ulong)uVar4) != 0;
    }
    else {
      bVar12 = false;
    }
    if ((required != 0) && (!bVar12)) {
      return 0x16;
    }
  }
  iVar5 = flatcc_verify_vector_field(td,id - 1,required,1,1,0xffffffff);
  if (iVar5 != 0) {
    iVar5 = flatcc_verify_vector_field(td,id - 1,required,1,1,0xffffffff);
    return iVar5;
  }
  if (uVar9 < uVar6) {
    uVar6 = *(ushort *)((long)td->vtable + (ulong)uVar9);
  }
  else {
    uVar6 = 0;
  }
  if (uVar6 == 0) {
    puVar10 = (uint *)0x0;
  }
  else {
    puVar10 = (uint *)((long)td->buf + (ulong)uVar6 + (ulong)td->table);
  }
  iVar5 = 0;
  if (puVar10 != (uint *)0x0) {
    uVar1 = *puVar10;
    uVar7 = *(uint *)((ulong)uVar1 + (long)puVar10);
    iVar5 = get_offset_field(td,id,required,&local_34);
    if (local_34 != 0 && iVar5 == 0) {
      if (td->ttl < 1) {
        iVar5 = 3;
      }
      else {
        pvVar3 = td->buf;
        uVar8 = *(int *)((long)pvVar3 + (ulong)local_34) + local_34;
        iVar5 = 0x10;
        if (local_34 < uVar8) {
          local_58.end = td->end;
          uVar11 = (ulong)uVar8;
          bVar12 = uVar11 + 4 <= (ulong)local_58.end;
          bVar13 = (uVar8 & 3) == 0;
          if (bVar13 && bVar12) {
            uVar2 = *(uint *)((long)pvVar3 + uVar11);
            if ((uVar2 < 0x40000000 && (uVar8 & 3) == 0) &&
               (uVar2 * 4 <= (local_58.end - uVar8) - 4)) {
              iVar5 = 0x22;
              if (uVar2 == uVar7) {
                local_58.ttl = td->ttl + -1;
                if ((ulong)uVar2 == 0) {
                  iVar5 = 0;
                }
                else {
                  uVar7 = *(int *)((long)pvVar3 + (ulong)local_34) + local_34;
                  uVar11 = 0;
                  local_58.buf = pvVar3;
                  do {
                    uVar7 = uVar7 + 4;
                    local_58.offset = *(flatbuffers_uoffset_t *)((long)pvVar3 + (ulong)uVar7);
                    local_58.type =
                         *(flatbuffers_utype_t *)((long)puVar10 + uVar11 + (ulong)uVar1 + 4);
                    if (local_58.offset == 0) {
                      if (local_58.type != '\0') {
                        return 0x20;
                      }
                    }
                    else {
                      if (local_58.type == '\0') {
                        return 0x21;
                      }
                      local_58.base = uVar7;
                      iVar5 = (*uvf)(&local_58);
                      if (iVar5 != 0) {
                        iVar5 = (*uvf)(&local_58);
                        return iVar5;
                      }
                    }
                    uVar11 = uVar11 + 1;
                    iVar5 = 0;
                  } while (uVar2 != uVar11);
                }
              }
            }
            else if ((bVar13 && bVar12) && ((uVar8 & 3) == 0)) {
              uVar1 = *(uint *)((long)pvVar3 + uVar11);
              if (uVar1 < 0x40000000) {
                iVar5 = 0x1a;
                if (uVar1 << 2 <= (local_58.end - uVar8) - 4) {
                  iVar5 = 0;
                }
              }
              else {
                iVar5 = (uint)(uVar1 >= 0x40000000) * 9 + 0x10;
              }
            }
          }
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int flatcc_verify_union_vector_field(flatcc_table_verifier_descriptor_t *td,
    flatbuffers_voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uoffset_t *buf;
    const utype_t *types;
    uoffset_t count, base;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        if (0 == (vte_table = read_vt_entry(td, id))) {
            verify(!required, flatcc_verify_error_type_field_absent_from_required_union_vector_field);
        }
    }
    check_result(flatcc_verify_vector_field(td, id - 1, required,
                utype_size, utype_size, FLATBUFFERS_COUNT_MAX(utype_size)));
    if (0 == (buf = get_field_ptr(td, id - 1))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    count = read_uoffset(buf, 0);
    ++buf;
    types = (utype_t *)buf;

    check_field(td, id, required, base);
    return verify_union_vector(td->buf, td->end, base, read_uoffset(td->buf, base),
            count, types, td->ttl, uvf);
}